

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

Image * rw::d3d::rasterToImage(Raster *raster)

{
  uint uVar1;
  uint8 *puVar2;
  code *pcVar3;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  Image *this;
  char *pcVar6;
  int32 iVar7;
  int iVar8;
  long lVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  bool bVar12;
  Error _e;
  
  puVar2 = raster->pixels;
  if (puVar2 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  lVar9 = (long)nativeRasterOffset;
  if (*(char *)((long)&raster->stride + lVar9 + 1) != '\x01') {
    uVar1 = raster->format;
    uVar4 = (uVar1 & 0xf00) - 0x100;
    if ((0x9ff < uVar4) || (uVar4 = uVar4 >> 8, (0x231U >> (uVar4 & 0x1f) & 1) == 0)) {
      _e.plugin = 0xb00;
      _e.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp",0x38e)
      ;
      __stream = _stderr;
      pcVar6 = dbgsprint(0x8000000a);
      fprintf(__stream,"%s\n",pcVar6);
      setError(&_e);
      return (Image *)0x0;
    }
    iVar5 = 0;
    if ((uVar1 >> 0xe & 1) == 0) {
      if ((uVar1 >> 0xd & 1) != 0) {
        iVar5 = 0x100;
        iVar7 = 8;
        goto LAB_00113039;
      }
      iVar7 = *(int32 *)(&DAT_00130b90 + (ulong)uVar4 * 4);
      bVar12 = true;
    }
    else {
      iVar5 = 0x10;
      iVar7 = 4;
LAB_00113039:
      bVar12 = false;
    }
    pcVar3 = (code *)(&PTR_conv_ARGB1555_from_ARGB1555_00143d28)[uVar4];
    this = Image::create(raster->width,raster->height,iVar7);
    Image::allocate(this);
    if (!bVar12) {
      puVar11 = this->palette;
      puVar10 = *(uint8 **)((long)&raster->flags + lVar9);
      while (bVar12 = iVar5 != 0, iVar5 = iVar5 + -1, bVar12) {
        conv_RGBA8888_from_RGBA8888(puVar11,puVar10);
        puVar10 = puVar10 + 4;
        puVar11 = puVar11 + 4;
      }
    }
    puVar11 = this->pixels;
    for (iVar5 = 0; iVar5 < this->height; iVar5 = iVar5 + 1) {
      puVar10 = puVar11;
      for (iVar8 = 0; iVar8 < this->width; iVar8 = iVar8 + 1) {
        (*pcVar3)(puVar10);
        puVar10 = puVar10 + this->bpp;
      }
      puVar11 = puVar11 + this->stride;
    }
    Image::compressPalette(this);
    goto joined_r0x001130da;
  }
  iVar5 = raster->width;
  if (raster->width < 5) {
    iVar5 = 4;
  }
  iVar7 = 4;
  if (4 < raster->height) {
    iVar7 = raster->height;
  }
  this = Image::create(iVar5,iVar7,0x20);
  Image::allocate(this);
  iVar5 = *(int *)((long)&raster->height + lVar9);
  if (iVar5 == 0x35545844) {
    iVar7 = 5;
LAB_00113005:
    Image::setPixelsDXT(this,iVar7,raster->pixels);
  }
  else {
    if (iVar5 == 0x33545844) {
      iVar7 = 3;
      goto LAB_00113005;
    }
    if (iVar5 != 0x31545844) {
      Image::destroy(this);
      this = (Image *)0x0;
      goto joined_r0x001130da;
    }
    Image::setPixelsDXT(this,1,raster->pixels);
    if ((raster->format & 0xf00U) == 0x200) {
      Image::removeMask(this);
    }
  }
  iVar7 = raster->height;
  this->width = raster->width;
  this->height = iVar7;
joined_r0x001130da:
  if (puVar2 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			if((raster->format & 0xF00) == Raster::C565)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_ARGB1555;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_BGRA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_BGR888;
		break;
	case Raster::C555:
		depth = 16;
		conv = conv_ARGB1555_from_RGB555;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		out = image->palette;
		in = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}